

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

byte * __thiscall
TTD::SlabAllocatorBase<8>::SlabAllocateRawSize<true,true>
          (SlabAllocatorBase<8> *this,size_t requestedBytes)

{
  int32 *piVar1;
  SlabBlock *pSVar2;
  long *plVar3;
  ulong uVar4;
  
  if (requestedBytes == 0) {
    TTDAbort_unrecoverable_error("Don\'t allocate empty arrays.");
  }
  if (requestedBytes < 0x1001) {
    uVar4 = (ulong)((int)requestedBytes + 0xbU & 0x3ffc);
    if ((requestedBytes + 8 <= uVar4) && (uVar4 < (ulong)this->m_slabBlockSize - 0x20)) {
      if (this->m_reserveActiveBytes == 0) {
        plVar3 = (long *)this->m_currPos;
        if (this->m_endPos < (byte *)((long)plVar3 + uVar4)) {
          AddNewBlock(this);
          plVar3 = (long *)this->m_currPos;
        }
        pSVar2 = this->m_headBlock;
        *plVar3 = (long)plVar3 - (long)pSVar2;
        this->m_currPos = (byte *)((long)plVar3 + uVar4);
        this->m_totalAllocatedSize = this->m_totalAllocatedSize + uVar4;
        piVar1 = &pSVar2->RefCounter;
        *piVar1 = *piVar1 + 1;
        return (byte *)(plVar3 + 1);
      }
      TTDAbort_unrecoverable_error("Don\'t double allocate memory.");
    }
    TTDAbort_unrecoverable_error("We can never allocate a block this big with the slab allocator!!")
    ;
  }
  TTDAbort_unrecoverable_error("Don\'t allocate large requests in the bump pool.");
}

Assistant:

byte* SlabAllocateRawSize(size_t requestedBytes)
        {
            TTDAssert(requestedBytes != 0, "Don't allocate empty arrays.");
            TTDAssert(requestedBytes <= TTD_SLAB_LARGE_BLOCK_SIZE, "Don't allocate large requests in the bump pool.");

            byte* res = nullptr;
            uint32 desiredsize = TTD_WORD_ALIGN_ALLOC_SIZE(requestedBytes + canUnlink); //make alloc size word aligned
            TTDAssert((desiredsize % 4 == 0) & (desiredsize >= (requestedBytes + canUnlink)) & (desiredsize < TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize)), "We can never allocate a block this big with the slab allocator!!");

            if (reserve)
            {
                TTDAssert(this->m_reserveActiveBytes == 0, "Don't double allocate memory.");

                if (this->m_currPos + desiredsize > this->m_endPos)
                {
                    this->AddNewBlock();
                }

                res = this->m_currPos;

                if (canUnlink)
                {
                    TTDAssert(canUnlink == sizeof(ptrdiff_t), "We need enough space for a ptr to the meta-data.");

                    //record the block associated with this allocation
                    *((ptrdiff_t*)res) = res - ((byte*)this->m_headBlock);

                    res += canUnlink;
                }
            }

            if (commit)
            {
                this->m_currPos += desiredsize;

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                this->m_totalAllocatedSize += desiredsize;
#endif

                if (canUnlink)
                {
                    this->m_headBlock->RefCounter++;
                }
            }

            if (reserve && !commit)
            {
                this->m_reserveActiveBytes = desiredsize;
            }

            if (!reserve && commit)
            {
                TTDAssert(desiredsize <= this->m_reserveActiveBytes, "We are commiting more that we reserved.");

                this->m_reserveActiveBytes = 0;
            }

            return res;
        }